

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

void __thiscall EmmyFacade::OnLuaStateGC(EmmyFacade *this,lua_State *L)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<Debugger> debugger;
  lua_State *L_local;
  EmmyFacade *this_local;
  
  debugger.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)L;
  EmmyDebuggerManager::RemoveDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffd8,
             (lua_State *)&this->_emmyDebuggerManager);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &stack0xffffffffffffffd8);
    Debugger::Detach(this_00);
  }
  if ((this->workMode == EmmyCore) &&
     (bVar1 = EmmyDebuggerManager::IsDebuggerEmpty(&this->_emmyDebuggerManager), bVar1)) {
    Destroy(this);
  }
  std::shared_ptr<Debugger>::~shared_ptr((shared_ptr<Debugger> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void EmmyFacade::OnLuaStateGC(lua_State *L) {
	auto debugger = _emmyDebuggerManager.RemoveDebugger(L);

	if (debugger) {
		debugger->Detach();
	}

	if (workMode == WorkMode::EmmyCore) {
		if (_emmyDebuggerManager.IsDebuggerEmpty()) {
			Destroy();
		}
	}
}